

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O2

void __thiscall
cpptrace::detail::panic(detail *this,char *signature,source_location location,string *message)

{
  bool bVar1;
  internal_error *this_00;
  char *signature_local;
  source_location location_local;
  pointer local_28;
  
  location_local.line = (int)location.file;
  signature_local = (char *)this;
  location_local.file = signature;
  bVar1 = std::operator==(location._8_8_,"");
  this_00 = (internal_error *)__cxa_allocate_exception(0x28);
  if (bVar1) {
    internal_error::internal_error<char_const*const&,int_const&,char_const*&>
              (this_00,"Cpptrace panic {}:{}: {}\n",&location_local.file,&location_local.line,
               &signature_local);
  }
  else {
    local_28 = ((location._8_8_)->_M_dataplus)._M_p;
    internal_error::internal_error<char_const*const&,int_const&,char_const*&,char_const*>
              (this_00,"Cpptrace panic {}:{}: {}: {}\n",&location_local.file,&location_local.line,
               &signature_local,&local_28);
  }
  __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
}

Assistant:

[[noreturn]] inline void panic(
        const char* signature,
        source_location location,
        const std::string& message = ""
    ) {
        if(message == "") {
            throw internal_error(
                "Cpptrace panic {}:{}: {}\n",
                location.file, location.line, signature
            );
        } else {
            throw internal_error(
                "Cpptrace panic {}:{}: {}: {}\n",
                location.file, location.line, signature, message.c_str()
            );
        }
    }